

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckColorContrast(TidyDocImpl *doc,Node *node)

{
  Attribute *pAVar1;
  int iVar2;
  uint uVar3;
  Bool BVar4;
  Bool BVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  AttVal *pAVar9;
  uint code;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ctmbstr cp;
  char *pcVar14;
  int brightBG;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int rgbFG [3];
  int rgbBG [3];
  int local_60 [4];
  int local_50 [4];
  int local_40;
  int local_3c;
  TidyDocImpl *local_38;
  
  local_50[0] = 0xff;
  local_50[1] = 0xff;
  local_50[2] = 0xff;
  if ((doc->access).PRIORITYCHK == 3) {
    pAVar9 = node->attributes;
    local_38 = doc;
    if (pAVar9 == (AttVal *)0x0) {
      bVar15 = true;
    }
    else {
      BVar5 = yes;
      do {
        if (((pAVar9->dict != (Attribute *)0x0) && (pAVar9->dict->id == TidyAttr_BGCOLOR)) &&
           (pcVar14 = pAVar9->value, pcVar14 != (char *)0x0)) {
          do {
            if (*pcVar14 == '\0') goto LAB_0015176c;
            BVar4 = prvTidyIsWhite((int)*pcVar14);
            pcVar14 = pcVar14 + 1;
          } while (BVar4 != no);
          BVar5 = GetRgb(pAVar9->value,local_50);
        }
LAB_0015176c:
        pAVar9 = pAVar9->next;
      } while (pAVar9 != (AttVal *)0x0);
      bVar15 = BVar5 != no;
    }
    pAVar9 = node->attributes;
    if ((bool)(pAVar9 != (AttVal *)0x0 & bVar15)) {
      local_3c = local_50[0];
      iVar6 = local_50[0] * 299;
      local_40 = local_50[1];
      iVar8 = local_50[1] * 0x24b;
      local_50[3] = local_50[2];
      iVar7 = local_50[2] * 0x72;
      do {
        pAVar1 = pAVar9->dict;
        if (pAVar1 == (Attribute *)0x0) {
          bVar17 = true;
          code = 0;
        }
        else {
          bVar16 = pAVar1->id == TidyAttr_TEXT;
          bVar17 = !bVar16;
          code = 0;
          if (bVar16) {
            code = 0x2b2;
          }
          if (!bVar16 && pAVar1 != (Attribute *)0x0) {
            bVar16 = pAVar1->id == TidyAttr_LINK;
            bVar17 = !bVar16;
            code = 0;
            if (bVar16) {
              code = 0x2b3;
            }
            if (!bVar16 && pAVar1 != (Attribute *)0x0) {
              bVar16 = pAVar1->id == TidyAttr_ALINK;
              bVar17 = !bVar16;
              code = 0;
              if (bVar16) {
                code = 0x2b4;
              }
              if (!bVar16 && pAVar1 != (Attribute *)0x0) {
                bVar17 = pAVar1->id != TidyAttr_VLINK;
                code = 0x2b5;
                if (bVar17) {
                  code = 0;
                }
              }
            }
          }
        }
        if ((!bVar17) && (pcVar14 = pAVar9->value, pcVar14 != (char *)0x0)) {
          do {
            if (*pcVar14 == '\0') goto LAB_00151944;
            BVar5 = prvTidyIsWhite((int)*pcVar14);
            pcVar14 = pcVar14 + 1;
          } while (BVar5 != no);
          local_60[2] = 0;
          local_60[0] = 0;
          local_60[1] = 0;
          BVar5 = GetRgb(pAVar9->value,local_60);
          if (BVar5 != no) {
            iVar2 = (int)((ulong)((long)(local_60[2] * 0x72 +
                                        local_60[1] * 0x24b + local_60[0] * 299) * -0x10624dd3) >>
                         0x20);
            uVar10 = ((iVar2 >> 6) - (iVar2 >> 0x1f)) + (iVar7 + iVar8 + iVar6) / 1000;
            uVar3 = -uVar10;
            if (0 < (int)uVar10) {
              uVar3 = uVar10;
            }
            iVar11 = local_3c - local_60[0];
            iVar2 = -iVar11;
            if (0 < iVar11) {
              iVar2 = iVar11;
            }
            iVar12 = local_40 - local_60[1];
            iVar11 = -iVar12;
            if (0 < iVar12) {
              iVar11 = iVar12;
            }
            iVar13 = local_50[3] - local_60[2];
            iVar12 = -iVar13;
            if (0 < iVar13) {
              iVar12 = iVar13;
            }
            if ((uVar3 < 0xb5) || ((uint)(iVar11 + iVar2 + iVar12) < 0x1f5)) {
              prvTidyReportAccessError(local_38,node,code);
            }
          }
        }
LAB_00151944:
        pAVar9 = pAVar9->next;
      } while ((bool)(bVar15 & pAVar9 != (AttVal *)0x0));
    }
  }
  return;
}

Assistant:

static void CheckColorContrast( TidyDocImpl* doc, Node* node )
{
    int rgbBG[3] = {255,255,255};   /* Black text on white BG */

    if (Level3_Enabled( doc ))
    {
        Bool gotBG = yes;
        AttVal* av;

        /* Check for 'BGCOLOR' first to compare with other color attributes */
        for ( av = node->attributes; av; av = av->next )
        {            
            if ( attrIsBGCOLOR(av) )
            {
                if ( hasValue(av) )
                    gotBG = GetRgb( av->value, rgbBG );
            }
        }
        
        /* 
           Search for COLOR attributes to compare with background color
           Must have valid colour contrast
        */
        for ( av = node->attributes; gotBG && av != NULL; av = av->next )
        {
            uint errcode = 0;
            if ( attrIsTEXT(av) )
                errcode = COLOR_CONTRAST_TEXT;
            else if ( attrIsLINK(av) )
                errcode = COLOR_CONTRAST_LINK;
            else if ( attrIsALINK(av) )
                errcode = COLOR_CONTRAST_ACTIVE_LINK;
            else if ( attrIsVLINK(av) )
                errcode = COLOR_CONTRAST_VISITED_LINK;

            if ( errcode && hasValue(av) )
            {
                int rgbFG[3] = {0, 0, 0};  /* Black text */

                if ( GetRgb(av->value, rgbFG) &&
                     !CompareColors(rgbBG, rgbFG) )
                {
                    TY_(ReportAccessError)( doc, node, errcode );
                }
            }
        }
    }
}